

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11VulkanPlatform.cpp
# Opt level: O0

void __thiscall tcu::x11::VulkanPlatform::describePlatform(VulkanPlatform *this,ostream *dst)

{
  int iVar1;
  runtime_error *this_00;
  ostream *poVar2;
  undefined1 local_19e [8];
  utsname sysInfo;
  ostream *dst_local;
  VulkanPlatform *this_local;
  
  sysInfo.domainname._57_8_ = dst;
  deMemset(local_19e,0,0x186);
  iVar1 = uname((utsname *)local_19e);
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"uname() failed");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = std::operator<<((ostream *)sysInfo.domainname._57_8_,"OS: ");
  poVar2 = std::operator<<(poVar2,local_19e);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,sysInfo.nodename + 0x39);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,sysInfo.release + 0x39);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)sysInfo.domainname._57_8_,"CPU: ");
  poVar2 = std::operator<<(poVar2,sysInfo.version + 0x39);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void VulkanPlatform::describePlatform (std::ostream& dst) const
{
	utsname		sysInfo;
	deMemset(&sysInfo, 0, sizeof(sysInfo));

	if (uname(&sysInfo) != 0)
		throw std::runtime_error("uname() failed");

	dst << "OS: " << sysInfo.sysname << " " << sysInfo.release << " " << sysInfo.version << "\n";
	dst << "CPU: " << sysInfo.machine << "\n";
}